

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O0

void RigidBodyDynamics::Math::SparseSolveLTx(Model *model,MatrixNd *L,VectorNd *x)

{
  double dVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  reference pvVar4;
  long in_RDI;
  double dVar5;
  uint j;
  uint i;
  Scalar in_stack_ffffffffffffffb8;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *in_stack_ffffffffffffffc0;
  undefined4 local_20;
  undefined4 local_1c;
  
  for (local_1c = *(uint *)(in_RDI + 0x50); local_1c != 0; local_1c = local_1c - 1) {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_ffffffffffffffc0,(Index)in_stack_ffffffffffffffb8);
    dVar5 = *pSVar2;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       (in_stack_ffffffffffffffc0,(Index)in_stack_ffffffffffffffb8,0x6ac219);
    dVar1 = *pSVar3;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_ffffffffffffffc0,(Index)in_stack_ffffffffffffffb8);
    *pSVar2 = dVar5 / dVar1;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x18),
                        (ulong)local_1c);
    local_20 = *pvVar4;
    while (local_20 != 0) {
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_ffffffffffffffc0,(Index)in_stack_ffffffffffffffb8);
      in_stack_ffffffffffffffc0 =
           (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)*pSVar2;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (in_stack_ffffffffffffffc0,(Index)in_stack_ffffffffffffffb8,0x6ac2ac);
      in_stack_ffffffffffffffb8 = *pSVar3;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_ffffffffffffffc0,(Index)in_stack_ffffffffffffffb8);
      dVar5 = -in_stack_ffffffffffffffb8 * *pSVar2 + (double)in_stack_ffffffffffffffc0;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_ffffffffffffffc0,(Index)in_stack_ffffffffffffffb8);
      *pSVar2 = dVar5;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x18),
                          (ulong)local_20);
      local_20 = *pvVar4;
    }
  }
  return;
}

Assistant:

RBDL_DLLAPI void SparseSolveLTx (Model &model, Math::MatrixNd &L, Math::VectorNd &x) {
  for (unsigned int i = model.qdot_size; i > 0; i--) {
    x[i - 1] = x[i - 1] / L(i - 1,i - 1);
    unsigned int j = model.lambda_q[i];
    while (j != 0) {
      x[j - 1] = x[j - 1] - L(i - 1,j - 1) * x[i - 1];
      j = model.lambda_q[j];
    }
  }
}